

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getLevelSize
          (anon_unknown_0 *this,deUint32 target,IVec3 *baseSize,int level)

{
  int iVar1;
  int *piVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  IVec3 IVar3;
  undefined4 local_2c;
  undefined4 local_28;
  int i_1;
  int i;
  int level_local;
  IVec3 *baseSize_local;
  deUint32 target_local;
  IVec3 *size;
  
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)this);
  if (target == 0x8c1a) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      piVar2 = tcu::Vector<int,_3>::operator[](baseSize,local_2c);
      iVar1 = de::max<int>(*piVar2 >> ((byte)level & 0x1f),1);
      piVar2 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)this,local_2c);
      *piVar2 = iVar1;
    }
    piVar2 = tcu::Vector<int,_3>::operator[](baseSize,2);
    iVar1 = *piVar2;
    piVar2 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)this,2);
    *piVar2 = iVar1;
    iVar1 = extraout_EDX_01;
  }
  else {
    iVar1 = extraout_EDX;
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      piVar2 = tcu::Vector<int,_3>::operator[](baseSize,local_28);
      iVar1 = de::max<int>(*piVar2 >> ((byte)level & 0x1f),1);
      piVar2 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)this,local_28);
      *piVar2 = iVar1;
      iVar1 = extraout_EDX_00;
    }
  }
  IVar3.m_data[2] = iVar1;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 getLevelSize (deUint32 target, const IVec3& baseSize, int level)
{
	IVec3 size;

	if (target != GL_TEXTURE_2D_ARRAY)
	{
		for (int i = 0; i < 3; i++)
			size[i] = de::max(baseSize[i] >> level, 1);
	}
	else
	{
		for (int i = 0; i < 2; i++)
			size[i] = de::max(baseSize[i] >> level, 1);

		size[2] = baseSize[2];
	}

	return size;
}